

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int defragmentPage(MemPage *pPage)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  u8 *puVar4;
  char *pcVar5;
  ushort uVar6;
  u16 uVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  int lineno;
  uint uVar11;
  uint uVar12;
  u8 *pCell;
  ulong uVar13;
  
  puVar4 = pPage->aData;
  pcVar5 = pPage->pBt->pPager->pTmpSpace;
  uVar8 = (ulong)pPage->hdrOffset;
  uVar1 = pPage->cellOffset;
  uVar2 = pPage->nCell;
  uVar3 = pPage->pBt->usableSize;
  uVar6 = *(ushort *)(puVar4 + uVar8 + 5) << 8 | *(ushort *)(puVar4 + uVar8 + 5) >> 8;
  memcpy(pcVar5 + uVar6,puVar4 + uVar6,(long)(int)(uVar3 - uVar6));
  uVar12 = (uint)uVar1 + (uint)uVar2 * 2;
  uVar9 = uVar3;
  for (uVar13 = 0; uVar2 != uVar13; uVar13 = uVar13 + 1) {
    uVar6 = *(ushort *)(puVar4 + uVar13 * 2 + (ulong)uVar1) << 8 |
            *(ushort *)(puVar4 + uVar13 * 2 + (ulong)uVar1) >> 8;
    lineno = 0xc5fa;
    if ((uVar6 < uVar12) ||
       (uVar11 = (uint)uVar6, uVar11 != uVar3 - 4 && (int)(uVar3 - 4) <= (int)(uint)uVar6))
    goto LAB_0013b206;
    pCell = (u8 *)(pcVar5 + uVar11);
    uVar7 = cellSizePtr(pPage,pCell);
    uVar9 = uVar9 - uVar7;
    lineno = 0xc606;
    if (((int)uVar9 < (int)uVar12) || ((int)uVar3 < (int)(uVar11 + uVar7))) goto LAB_0013b206;
    memcpy(puVar4 + uVar9,pCell,(ulong)uVar7);
    *(ushort *)(puVar4 + uVar13 * 2 + (ulong)uVar1) = (ushort)uVar9 << 8 | (ushort)uVar9 >> 8;
  }
  *(ushort *)(puVar4 + uVar8 + 5) = (ushort)uVar9 << 8 | (ushort)uVar9 >> 8;
  (puVar4 + uVar8 + 1)[0] = '\0';
  (puVar4 + uVar8 + 1)[1] = '\0';
  puVar4[uVar8 + 7] = '\0';
  iVar10 = 0;
  memset(puVar4 + uVar12,0,(long)(int)(uVar9 - uVar12));
  lineno = 0xc617;
  if (uVar9 - uVar12 != (uint)pPage->nFree) {
LAB_0013b206:
    sqlite3CorruptError(lineno);
    iVar10 = 0xb;
  }
  return iVar10;
}

Assistant:

static int defragmentPage(MemPage *pPage){
  int i;                     /* Loop counter */
  int pc;                    /* Address of a i-th cell */
  int hdr;                   /* Offset to the page header */
  int size;                  /* Size of a cell */
  int usableSize;            /* Number of usable bytes on a page */
  int cellOffset;            /* Offset to the cell pointer array */
  int cbrk;                  /* Offset to the cell content area */
  int nCell;                 /* Number of cells on the page */
  unsigned char *data;       /* The page data */
  unsigned char *temp;       /* Temp area for cell content */
  int iCellFirst;            /* First allowable cell index */
  int iCellLast;             /* Last possible cell index */


  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  assert( pPage->pBt!=0 );
  assert( pPage->pBt->usableSize <= SQLITE_MAX_PAGE_SIZE );
  assert( pPage->nOverflow==0 );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  temp = sqlite3PagerTempSpace(pPage->pBt->pPager);
  data = pPage->aData;
  hdr = pPage->hdrOffset;
  cellOffset = pPage->cellOffset;
  nCell = pPage->nCell;
  assert( nCell==get2byte(&data[hdr+3]) );
  usableSize = pPage->pBt->usableSize;
  cbrk = get2byte(&data[hdr+5]);
  memcpy(&temp[cbrk], &data[cbrk], usableSize - cbrk);
  cbrk = usableSize;
  iCellFirst = cellOffset + 2*nCell;
  iCellLast = usableSize - 4;
  for(i=0; i<nCell; i++){
    u8 *pAddr;     /* The i-th cell pointer */
    pAddr = &data[cellOffset + i*2];
    pc = get2byte(pAddr);
    testcase( pc==iCellFirst );
    testcase( pc==iCellLast );
#if !defined(SQLITE_ENABLE_OVERSIZE_CELL_CHECK)
    /* These conditions have already been verified in btreeInitPage()
    ** if SQLITE_ENABLE_OVERSIZE_CELL_CHECK is defined 
    */
    if( pc<iCellFirst || pc>iCellLast ){
      return SQLITE_CORRUPT_BKPT;
    }
#endif
    assert( pc>=iCellFirst && pc<=iCellLast );
    size = cellSizePtr(pPage, &temp[pc]);
    cbrk -= size;
#if defined(SQLITE_ENABLE_OVERSIZE_CELL_CHECK)
    if( cbrk<iCellFirst ){
      return SQLITE_CORRUPT_BKPT;
    }
#else
    if( cbrk<iCellFirst || pc+size>usableSize ){
      return SQLITE_CORRUPT_BKPT;
    }
#endif
    assert( cbrk+size<=usableSize && cbrk>=iCellFirst );
    testcase( cbrk+size==usableSize );
    testcase( pc+size==usableSize );
    memcpy(&data[cbrk], &temp[pc], size);
    put2byte(pAddr, cbrk);
  }
  assert( cbrk>=iCellFirst );
  put2byte(&data[hdr+5], cbrk);
  data[hdr+1] = 0;
  data[hdr+2] = 0;
  data[hdr+7] = 0;
  memset(&data[iCellFirst], 0, cbrk-iCellFirst);
  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  if( cbrk-iCellFirst!=pPage->nFree ){
    return SQLITE_CORRUPT_BKPT;
  }
  return SQLITE_OK;
}